

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSMState::FSMState(FSMState *this,string *name,FSM *parent)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
  super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
  super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->parent_ = parent;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->output_values_)._M_t._M_impl.super__Rb_tree_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_state_fn_ln_)._M_h._M_buckets = &(this->next_state_fn_ln_)._M_h._M_single_bucket;
  (this->next_state_fn_ln_)._M_h._M_bucket_count = 1;
  (this->next_state_fn_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->next_state_fn_ln_)._M_h._M_element_count = 0;
  (this->next_state_fn_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->next_state_fn_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->next_state_fn_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->output_fn_ln_)._M_h._M_buckets = &(this->output_fn_ln_)._M_h._M_single_bucket;
  (this->output_fn_ln_)._M_h._M_bucket_count = 1;
  (this->output_fn_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->output_fn_ln_)._M_h._M_element_count = 0;
  (this->output_fn_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->output_fn_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->output_fn_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

FSMState::FSMState(std::string name, FSM* parent) : name_(std::move(name)), parent_(parent) {}